

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_stages<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info,ScratchAllocator *alloc,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,DynamicStateInfo *dynamic_state_info)

{
  Impl *__s;
  VkSpecializationInfo *info_00;
  bool bVar1;
  VkPipelineShaderStageCreateInfo *__dest;
  size_t sVar2;
  Impl *__dest_00;
  long lVar3;
  Impl *this_00;
  VkPipelineShaderStageCreateInfo *pVVar4;
  ulong uVar5;
  ptrdiff_t _Num;
  size_t sVar6;
  void *pNext;
  void *local_60;
  VkGraphicsPipelineCreateInfo *local_58;
  VkDevice local_50;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT local_48;
  Impl *local_40;
  DynamicStateInfo *local_38;
  
  if ((ulong)info->stageCount == 0) {
    info->pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  }
  else {
    pVVar4 = info->pStages;
    sVar6 = (ulong)info->stageCount * 0x30;
    local_50 = device;
    local_48 = gsmcii;
    local_40 = this;
    local_38 = dynamic_state_info;
    __dest = (VkPipelineShaderStageCreateInfo *)ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (__dest != (VkPipelineShaderStageCreateInfo *)0x0) {
      memmove(__dest,pVVar4,sVar6);
    }
    info->pStages = __dest;
    if (info->stageCount == 0) {
      return true;
    }
    lVar3 = 0x28;
    uVar5 = 0;
    local_58 = info;
    do {
      pVVar4 = local_58->pStages;
      __s = *(Impl **)((long)pVVar4 + lVar3 + -8);
      if (__s == (Impl *)0x0) {
        return false;
      }
      this_00 = __s;
      sVar2 = strlen((char *)__s);
      sVar6 = sVar2 + 1;
      if ((sVar6 == 0) ||
         (this_00 = (Impl *)alloc,
         __dest_00 = (Impl *)ScratchAllocator::allocate_raw(alloc,sVar6,0x10),
         __dest_00 == (Impl *)0x0)) {
        __dest_00 = (Impl *)0x0;
      }
      else {
        this_00 = __dest_00;
        memmove(__dest_00,__s,sVar6);
      }
      *(Impl **)((long)pVVar4 + lVar3 + -8) = __dest_00;
      info_00 = *(VkSpecializationInfo **)((long)&pVVar4->sType + lVar3);
      if (info_00 != (VkSpecializationInfo *)0x0) {
        copy_specialization_info
                  (this_00,info_00,alloc,(VkSpecializationInfo **)((long)&pVVar4->sType + lVar3));
      }
      local_60 = (void *)0x0;
      bVar1 = copy_pnext_chain(local_40,*(void **)((long)pVVar4 + lVar3 + -0x20),alloc,&local_60,
                               local_38,0);
      if (!bVar1) {
        return false;
      }
      pVVar4 = (VkPipelineShaderStageCreateInfo *)(lVar3 + -0x28 + (long)pVVar4);
      pVVar4->pNext = local_60;
      bVar1 = add_module_identifier(pVVar4,alloc,local_50,local_48);
      if (!bVar1) {
        return false;
      }
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar5 < local_58->stageCount);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_stages(CreateInfo *info, ScratchAllocator &alloc,
                                      VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                      const DynamicStateInfo *dynamic_state_info)
{
	info->pStages = copy(info->pStages, info->stageCount, alloc);
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);

		if (!stage.pName)
			return false;

		stage.pName = copy(stage.pName, strlen(stage.pName) + 1, alloc);
		if (stage.pSpecializationInfo)
			if (!copy_specialization_info(stage.pSpecializationInfo, alloc, &stage.pSpecializationInfo))
				return false;

		const void *pNext = nullptr;
		if (!copy_pnext_chain(stage.pNext, alloc, &pNext, dynamic_state_info, 0))
			return false;

		stage.pNext = pNext;

		if (!add_module_identifier(&stage, alloc, device, gsmcii))
			return false;
	}

	return true;
}